

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFeaturePrint.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::CoreMLModels::AudioFeaturePrint::ByteSizeLong(AudioFeaturePrint *this)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  
  if (this->_oneof_case_[0] == 0x14) {
    uVar1 = ((this->AudioFeaturePrintType_).sound_)->version_;
    if (uVar1 == 0) {
      uVar3 = 0;
    }
    else if ((int)uVar1 < 0) {
      uVar3 = 0xb;
    }
    else {
      iVar2 = 0x1f;
      if ((uVar1 | 1) != 0) {
        for (; (uVar1 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar3 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
    }
    ((this->AudioFeaturePrintType_).sound_)->_cached_size_ = (int)uVar3;
    sVar4 = uVar3 + 3;
  }
  else {
    sVar4 = 0;
  }
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t AudioFeaturePrint::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CoreMLModels.AudioFeaturePrint)
  size_t total_size = 0;

  switch (AudioFeaturePrintType_case()) {
    // .CoreML.Specification.CoreMLModels.AudioFeaturePrint.Sound sound = 20;
    case kSound: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *AudioFeaturePrintType_.sound_);
      break;
    }
    case AUDIOFEATUREPRINTTYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}